

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromScene(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  uint uVar1;
  undefined8 uVar2;
  Float FVar3;
  size_t sVar4;
  LensElementInterface *pLVar5;
  LensElementInterface *pLVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  long lVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  Float t;
  Point3fi o;
  Transform LensFromCamera;
  float local_14c;
  Ray local_148;
  Point3fi local_118;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Transform local_b8;
  
  sVar4 = (this->elementInterfaces).nStored;
  fVar21 = 0.0;
  fVar43 = 0.0;
  if (sVar4 != 0) {
    lVar17 = 0;
    do {
      fVar21 = fVar21 + *(float *)((long)&((this->elementInterfaces).ptr)->thickness + lVar17);
      lVar17 = lVar17 + 0x10;
      fVar43 = fVar21;
    } while (sVar4 << 4 != lVar17);
  }
  local_e8 = ZEXT416((uint)fVar43);
  Scale(&local_b8,1.0,1.0,-1.0);
  fVar21 = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar22._4_4_ = fVar21;
  auVar22._0_4_ = fVar21;
  auVar22._8_4_ = fVar21;
  auVar22._12_4_ = fVar21;
  fVar21 = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar25._4_4_ = fVar21;
  auVar25._0_4_ = fVar21;
  auVar25._8_4_ = fVar21;
  auVar25._12_4_ = fVar21;
  fVar21 = (rCamera->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar30._4_4_ = fVar21;
  auVar30._0_4_ = fVar21;
  auVar30._8_4_ = fVar21;
  auVar30._12_4_ = fVar21;
  auVar20 = vmovlhps_avx(auVar22,auVar25);
  local_148.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar20._0_8_;
  local_148.o.super_Tuple3<pbrt::Point3,_float>.z = auVar20._8_4_;
  local_148.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar20._12_4_;
  uVar2 = vmovlps_avx(auVar30);
  local_148.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  local_148.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)uVar2 >> 0x20);
  Transform::operator()(&local_118,&local_b8,(Point3fi *)&local_148);
  auVar20._4_4_ = local_b8.m.m[0][2];
  auVar20._8_4_ = local_b8.m.m[0][3];
  auVar20._0_4_ = local_b8.m.m[0][1];
  auVar20._12_4_ = local_b8.m.m[1][0];
  fVar21 = (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar7._4_4_ = local_b8.m.m[0][1];
  auVar7._0_4_ = local_b8.m.m[0][0];
  auVar7._8_4_ = local_b8.m.m[0][2];
  auVar7._12_4_ = local_b8.m.m[0][3];
  fVar43 = (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar36._4_4_ = fVar43;
  auVar36._0_4_ = fVar43;
  auVar36._8_4_ = fVar43;
  auVar36._12_4_ = fVar43;
  auVar8._8_4_ = local_b8.m.m[1][0];
  auVar8._0_4_ = local_b8.m.m[0][2];
  auVar8._4_4_ = local_b8.m.m[0][3];
  auVar8._12_4_ = local_b8.m.m[1][1];
  auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_b8.m.m[1][1]),0x10);
  auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_b8.m.m[1][0]),0x10);
  auVar8 = vinsertps_avx(auVar8,ZEXT416((uint)local_b8.m.m[1][2]),0x10);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * local_b8.m.m[2][1])),auVar36,
                            ZEXT416((uint)local_b8.m.m[2][0]));
  auVar26._0_4_ = fVar21 * auVar20._0_4_;
  auVar26._4_4_ = fVar21 * auVar20._4_4_;
  auVar26._8_4_ = fVar21 * auVar20._8_4_;
  auVar26._12_4_ = fVar21 * auVar20._12_4_;
  auVar20 = vfmadd213ps_fma(auVar7,auVar36,auVar26);
  fVar21 = (rCamera->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._4_4_ = fVar21;
  auVar27._0_4_ = fVar21;
  auVar27._8_4_ = fVar21;
  auVar27._12_4_ = fVar21;
  auVar22 = vfmadd231ss_fma(auVar22,auVar27,ZEXT416((uint)local_b8.m.m[2][2]));
  auVar8 = vfmadd213ps_fma(auVar8,auVar27,auVar20);
  fVar43 = auVar8._0_4_;
  auVar23._0_4_ = fVar43 * fVar43;
  fVar9 = auVar8._4_4_;
  auVar23._4_4_ = fVar9 * fVar9;
  fVar10 = auVar8._8_4_;
  auVar23._8_4_ = fVar10 * fVar10;
  fVar11 = auVar8._12_4_;
  auVar23._12_4_ = fVar11 * fVar11;
  local_148.o.super_Tuple3<pbrt::Point3,_float>.z = auVar22._0_4_;
  auVar7 = vmovshdup_avx(auVar8);
  auVar20 = vhaddps_avx(auVar23,auVar23);
  fVar21 = auVar20._0_4_ +
           local_148.o.super_Tuple3<pbrt::Point3,_float>.z *
           local_148.o.super_Tuple3<pbrt::Point3,_float>.z;
  if (0.0 < fVar21) {
    auVar28._8_4_ = 0x7fffffff;
    auVar28._0_8_ = 0x7fffffff7fffffff;
    auVar28._12_4_ = 0x7fffffff;
    auVar20 = vandps_avx(auVar7,auVar28);
    auVar23 = vandps_avx(auVar8,auVar28);
    auVar25 = vandps_avx(auVar22,auVar28);
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 0.0)),ZEXT816(0) << 0x20,auVar23);
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT816(0) << 0x20,auVar25);
    fVar21 = auVar20._0_4_ / fVar21;
    local_148.o.super_Tuple3<pbrt::Point3,_float>.z =
         local_148.o.super_Tuple3<pbrt::Point3,_float>.z * fVar21;
    auVar29._0_4_ = fVar43 * fVar21;
    auVar29._4_4_ = fVar9 * fVar21;
    auVar29._8_4_ = fVar10 * fVar21;
    auVar29._12_4_ = fVar11 * fVar21;
    local_148.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar29);
    local_f8 = auVar8;
    local_d8 = auVar22;
    local_c8 = auVar7;
    Point3fi::operator+=(&local_118,(Vector3<float> *)&local_148);
    auVar8 = local_f8;
    auVar7 = local_c8;
    auVar22 = local_d8;
  }
  auVar45 = ZEXT1664(auVar22);
  auVar42 = ZEXT1664(auVar7);
  auVar41 = ZEXT1664(auVar8);
  auVar15._4_4_ =
       local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar15._0_4_ =
       local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar15._8_4_ =
       local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar15._12_4_ =
       local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  local_148.time = rCamera->time;
  local_148.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(rCamera->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar20 = vinsertps_avx(auVar15,ZEXT416((uint)local_118.super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar24._0_4_ =
       local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
       auVar20._0_4_;
  auVar24._4_4_ =
       local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar20._4_4_;
  auVar24._8_4_ = auVar20._8_4_ + 0.0;
  auVar24._12_4_ = auVar20._12_4_ + 0.0;
  auVar12._8_4_ = 0x3f000000;
  auVar12._0_8_ = 0x3f0000003f000000;
  auVar12._12_4_ = 0x3f000000;
  auVar19 = vmulps_avx512vl(auVar24,auVar12);
  local_148.o.super_Tuple3<pbrt::Point3,_float>.z =
       (local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
       0.5;
  local_148.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar19);
  uVar2 = vmovlps_avx(auVar8);
  local_148.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  local_148.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  local_148.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar22._0_4_;
  if ((this->elementInterfaces).nStored != 0) {
    auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
    lVar17 = 0;
    uVar18 = 0;
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar20 = vxorps_avx512vl(local_e8,auVar13);
    auVar46 = ZEXT1664(auVar20);
    do {
      pLVar5 = (this->elementInterfaces).ptr;
      local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = 0.0;
      local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = 0.0
      ;
      local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = 0.0;
      fVar21 = *(float *)((long)&pLVar5->curvatureRadius + lVar17);
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        local_e8 = auVar46._0_16_;
        local_f8._0_4_ = fVar21;
        bVar16 = IntersectSphericalElement
                           (fVar21,auVar46._0_4_ + fVar21,&local_148,&local_14c,
                            (Normal3f *)&local_118);
        auVar46 = ZEXT1664(local_e8);
        auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
        if (!bVar16) {
          return 0.0;
        }
        auVar37._4_4_ = local_148.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar37._0_4_ = local_148.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar37._8_8_ = 0;
        auVar41 = ZEXT1664(auVar37);
        auVar48._8_8_ = 0;
        auVar48._0_4_ = local_148.o.super_Tuple3<pbrt::Point3,_float>.x;
        auVar48._4_4_ = local_148.o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar20 = vmovshdup_avx(auVar37);
        auVar42 = ZEXT1664(auVar20);
        fVar21 = (float)local_f8._0_4_;
      }
      else {
        local_14c = (auVar46._0_4_ - local_148.o.super_Tuple3<pbrt::Point3,_float>.z) /
                    auVar45._0_4_;
        auVar48 = auVar19;
        if (local_14c < 0.0) {
          return 0.0;
        }
      }
      auVar20 = vinsertps_avx(auVar41._0_16_,auVar42._0_16_,0x10);
      fVar43 = *(float *)((long)&pLVar5->apertureRadius + lVar17);
      auVar19._0_4_ = auVar48._0_4_ + local_14c * auVar20._0_4_;
      auVar19._4_4_ = auVar48._4_4_ + local_14c * auVar20._4_4_;
      auVar19._8_4_ = auVar48._8_4_ + local_14c * auVar20._8_4_;
      auVar19._12_4_ = auVar48._12_4_ + local_14c * auVar20._12_4_;
      auVar31._0_4_ = auVar19._0_4_ * auVar19._0_4_;
      auVar31._4_4_ = auVar19._4_4_ * auVar19._4_4_;
      auVar31._8_4_ = auVar19._8_4_ * auVar19._8_4_;
      auVar31._12_4_ = auVar19._12_4_ * auVar19._12_4_;
      auVar20 = vmovshdup_avx(auVar31);
      auVar20 = vfmadd231ss_fma(auVar20,auVar19,auVar19);
      if (fVar43 * fVar43 < auVar20._0_4_) {
        return 0.0;
      }
      local_148.o.super_Tuple3<pbrt::Point3,_float>.z =
           local_148.d.super_Tuple3<pbrt::Vector3,_float>.z * local_14c +
           local_148.o.super_Tuple3<pbrt::Point3,_float>.z;
      local_148.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar19);
      if ((fVar21 != 0.0) || (NAN(fVar21))) {
        pLVar6 = (this->elementInterfaces).ptr;
        fVar21 = 1.0;
        if (uVar18 != 0) {
          fVar43 = *(float *)((long)pLVar6 + lVar17 + -8);
          if ((fVar43 != 0.0) || (NAN(fVar43))) {
            fVar21 = fVar43;
          }
        }
        uVar1 = *(uint *)((long)&pLVar6->eta + lVar17);
        auVar34._0_4_ = auVar41._0_4_ * auVar41._0_4_;
        auVar34._4_4_ = auVar41._4_4_ * auVar41._4_4_;
        fVar43 = auVar41._8_4_;
        auVar34._8_4_ = fVar43 * fVar43;
        fVar9 = auVar41._12_4_;
        auVar34._12_4_ = fVar9 * fVar9;
        auVar20 = vhaddps_avx(auVar34,auVar34);
        auVar22 = auVar47._0_16_;
        uVar2 = vcmpss_avx512f(ZEXT416(uVar1),auVar22,4);
        bVar16 = (bool)((byte)uVar2 & 1);
        auVar32._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
        auVar32._8_4_ = -fVar43;
        auVar32._12_4_ = -fVar9;
        auVar38._0_4_ = -local_148.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar38._4_4_ = 0x80000000;
        auVar38._8_4_ = 0x80000000;
        auVar38._12_4_ = 0x80000000;
        fVar21 = (float)(bVar16 * uVar1 + (uint)!bVar16 * 0x3f800000) / fVar21;
        auVar20 = ZEXT416((uint)(auVar20._0_4_ +
                                local_148.d.super_Tuple3<pbrt::Vector3,_float>.z *
                                local_148.d.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar20 = vsqrtss_avx(auVar20,auVar20);
        fVar43 = auVar20._0_4_;
        auVar35._4_4_ = fVar43;
        auVar35._0_4_ = fVar43;
        auVar35._8_4_ = fVar43;
        auVar35._12_4_ = fVar43;
        auVar20 = vdivps_avx(auVar32,auVar35);
        auVar33._0_4_ = auVar38._0_4_ / fVar43;
        auVar33._4_12_ = auVar38._4_12_;
        auVar39._4_4_ =
             local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        auVar39._0_4_ =
             local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
        ;
        auVar39._8_8_ = 0;
        auVar7 = vmovshdup_avx(auVar39);
        auVar8 = vmovshdup_avx(auVar20);
        auVar7 = vfmadd213ss_fma(auVar7,auVar8,
                                 ZEXT416((uint)(local_118.super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low *
                                               auVar33._0_4_)));
        auVar8 = vfmsub231ss_fma(ZEXT416((uint)(local_118.super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low *
                                               auVar33._0_4_)),
                                 ZEXT416((uint)local_118.super_Point3<pbrt::Interval>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low),
                                 auVar33);
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ + auVar8._0_4_)),auVar39,auVar20);
        auVar7 = vfnmadd213ss_fma(auVar8,auVar8,SUB6416(ZEXT464(0x3f800000),0));
        auVar7 = vmaxss_avx(auVar7,auVar22);
        fVar43 = auVar7._0_4_ / (fVar21 * fVar21);
        if (1.0 <= fVar43) {
          return 0.0;
        }
        auVar7 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar43)),auVar22);
        auVar7 = vsqrtss_avx(auVar7,auVar7);
        fVar43 = auVar8._0_4_ / fVar21 - auVar7._0_4_;
        auVar44._4_4_ = fVar21;
        auVar44._0_4_ = fVar21;
        auVar44._8_4_ = fVar21;
        auVar44._12_4_ = fVar21;
        auVar20 = vdivps_avx(auVar20,auVar44);
        auVar40._0_4_ =
             local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low
             * fVar43;
        auVar40._4_4_ =
             local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high * fVar43;
        auVar40._8_4_ = fVar43 * 0.0;
        auVar40._12_4_ = fVar43 * 0.0;
        local_148.d.super_Tuple3<pbrt::Vector3,_float>.z =
             local_118.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low
             * fVar43 - auVar33._0_4_ / fVar21;
        auVar7 = vsubps_avx(auVar40,auVar20);
        auVar41 = ZEXT1664(auVar7);
        auVar20 = vmovshdup_avx(auVar7);
        auVar42 = ZEXT1664(auVar20);
        uVar2 = vmovlps_avx(auVar7);
        local_148.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
        local_148.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
      }
      auVar45 = ZEXT464((uint)local_148.d.super_Tuple3<pbrt::Vector3,_float>.z);
      auVar46 = ZEXT464((uint)(auVar46._0_4_ + *(float *)((long)&pLVar5->thickness + lVar17)));
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 0x10;
    } while (uVar18 < (this->elementInterfaces).nStored);
  }
  if (rOut != (Ray *)0x0) {
    auVar14._8_4_ = local_148.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar14._0_8_ =
         CONCAT44(local_148.d.super_Tuple3<pbrt::Vector3,_float>.y,
                  local_148.d.super_Tuple3<pbrt::Vector3,_float>.x);
    auVar14._12_4_ = local_148.time;
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.x = local_148.o.super_Tuple3<pbrt::Point3,_float>.x;
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.y = local_148.o.super_Tuple3<pbrt::Point3,_float>.y;
    (rOut->o).super_Tuple3<pbrt::Point3,_float>.z = -local_148.o.super_Tuple3<pbrt::Point3,_float>.z
    ;
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.x =
         local_148.d.super_Tuple3<pbrt::Vector3,_float>.x;
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.y =
         local_148.d.super_Tuple3<pbrt::Vector3,_float>.y;
    (rOut->d).super_Tuple3<pbrt::Vector3,_float>.z =
         -local_148.d.super_Tuple3<pbrt::Vector3,_float>.z;
    FVar3 = (Float)vextractps_avx(auVar14,3);
    rOut->time = FVar3;
    (rOut->medium).
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
  }
  return 1.0;
}

Assistant:

Float RealisticCamera::TraceLensesFromScene(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = -LensFrontZ();
    // Transform _rCamera_ from camera to lens system space
    const Transform LensFromCamera = Scale(1, 1, -1);
    Ray rLens = LensFromCamera(rCamera);
    for (size_t i = 0; i < elementInterfaces.size(); ++i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;
        } else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }

        // Test intersection point against element aperture
        // Don't worry about the aperture image here.
        Point3f pHit = rLens(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        if (r2 > element.apertureRadius * element.apertureRadius)
            return 0;
        rLens.o = pHit;

        // Update ray path for from-scene element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = (i == 0 || elementInterfaces[i - 1].eta == 0)
                              ? 1
                              : elementInterfaces[i - 1].eta;
            Float eta_t = (elementInterfaces[i].eta != 0) ? elementInterfaces[i].eta : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &wt))
                return 0;
            rLens.d = wt;
        }
        elementZ += element.thickness;
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);
    return 1;
}